

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AsyncRgbLedAnalyzerSettings.cpp
# Opt level: O0

void __thiscall
AsyncRgbLedAnalyzerSettings::LoadSettings(AsyncRgbLedAnalyzerSettings *this,char *settings)

{
  Controller local_30 [2];
  U32 controllerInt;
  SimpleArchive local_20 [8];
  SimpleArchive text_archive;
  char *settings_local;
  AsyncRgbLedAnalyzerSettings *this_local;
  
  _text_archive = settings;
  SimpleArchive::SimpleArchive(local_20);
  SimpleArchive::SetString((char *)local_20);
  SimpleArchive::operator>>(local_20,&this->mInputChannel);
  SimpleArchive::operator>>(local_20,local_30);
  this->mLEDController = local_30[0];
  AnalyzerSettings::ClearChannels();
  AnalyzerSettings::AddChannel
            ((Channel *)this,(char *)&this->mInputChannel,SUB81(DEFAULT_CHANNEL_NAME,0));
  UpdateInterfacesFromSettings(this);
  SimpleArchive::~SimpleArchive(local_20);
  return;
}

Assistant:

void AsyncRgbLedAnalyzerSettings::LoadSettings( const char* settings )
{
    SimpleArchive text_archive;
    text_archive.SetString( settings );

    U32 controllerInt;
    text_archive >> mInputChannel;
    text_archive >> controllerInt;
    mLEDController = static_cast<Controller>( controllerInt );

    ClearChannels();
    AddChannel( mInputChannel, DEFAULT_CHANNEL_NAME, true );

    UpdateInterfacesFromSettings();
}